

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::Builtins::registerStringMethods(Builtins *this)

{
  StringLenMethod *this_00;
  StringPutcMethod *this_01;
  StringGetcMethod *this_02;
  StringUpperLowerMethod *pSVar1;
  StringCompareMethod *pSVar2;
  StringSubstrMethod *this_03;
  StringAtoIMethod *pSVar3;
  StringAtoRealMethod *this_04;
  StringItoAMethod *pSVar4;
  StringRealtoAMethod *this_05;
  pointer *__ptr;
  _Head_base<0UL,_slang::ast::builtins::StringLenMethod_*,_false> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_130;
  shared_ptr<slang::ast::SystemSubroutine> local_120;
  shared_ptr<slang::ast::SystemSubroutine> local_110;
  shared_ptr<slang::ast::SystemSubroutine> local_100;
  shared_ptr<slang::ast::SystemSubroutine> local_f0;
  shared_ptr<slang::ast::SystemSubroutine> local_e0;
  shared_ptr<slang::ast::SystemSubroutine> local_d0;
  shared_ptr<slang::ast::SystemSubroutine> local_c0;
  shared_ptr<slang::ast::SystemSubroutine> local_b0;
  shared_ptr<slang::ast::SystemSubroutine> local_a0;
  shared_ptr<slang::ast::SystemSubroutine> local_90;
  shared_ptr<slang::ast::SystemSubroutine> local_80;
  shared_ptr<slang::ast::SystemSubroutine> local_70;
  shared_ptr<slang::ast::SystemSubroutine> local_60;
  shared_ptr<slang::ast::SystemSubroutine> local_50;
  shared_ptr<slang::ast::SystemSubroutine> local_40;
  shared_ptr<slang::ast::SystemSubroutine> local_30;
  shared_ptr<slang::ast::SystemSubroutine> local_20;
  
  this_00 = (StringLenMethod *)operator_new(0x68);
  StringLenMethod::StringLenMethod(this_00,this);
  local_138._M_head_impl = this_00;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringLenMethod,std::default_delete<slang::ast::builtins::StringLenMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (unique_ptr<slang::ast::builtins::StringLenMethod,_std::default_delete<slang::ast::builtins::StringLenMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_20);
  if (local_20.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  this_01 = (StringPutcMethod *)operator_new(0x68);
  StringPutcMethod::StringPutcMethod(this_01,this);
  local_138._M_head_impl = (StringLenMethod *)this_01;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringPutcMethod,std::default_delete<slang::ast::builtins::StringPutcMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (unique_ptr<slang::ast::builtins::StringPutcMethod,_std::default_delete<slang::ast::builtins::StringPutcMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_30);
  if (local_30.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  this_02 = (StringGetcMethod *)operator_new(0x68);
  StringGetcMethod::StringGetcMethod(this_02,this);
  local_138._M_head_impl = (StringLenMethod *)this_02;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringGetcMethod,std::default_delete<slang::ast::builtins::StringGetcMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (unique_ptr<slang::ast::builtins::StringGetcMethod,_std::default_delete<slang::ast::builtins::StringGetcMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_40);
  if (local_40.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar1 = (StringUpperLowerMethod *)operator_new(0x68);
  StringUpperLowerMethod::StringUpperLowerMethod(pSVar1,this,ToUpper,true);
  local_138._M_head_impl = (StringLenMethod *)pSVar1;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringUpperLowerMethod,std::default_delete<slang::ast::builtins::StringUpperLowerMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_50);
  if (local_50.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar1 = (StringUpperLowerMethod *)operator_new(0x68);
  StringUpperLowerMethod::StringUpperLowerMethod(pSVar1,this,ToLower,false);
  local_138._M_head_impl = (StringLenMethod *)pSVar1;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringUpperLowerMethod,std::default_delete<slang::ast::builtins::StringUpperLowerMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_60,
             (unique_ptr<slang::ast::builtins::StringUpperLowerMethod,_std::default_delete<slang::ast::builtins::StringUpperLowerMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_60);
  if (local_60.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar2 = (StringCompareMethod *)operator_new(0x68);
  StringCompareMethod::StringCompareMethod(pSVar2,this,Compare,false);
  local_138._M_head_impl = (StringLenMethod *)pSVar2;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringCompareMethod,std::default_delete<slang::ast::builtins::StringCompareMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_70,
             (unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_70);
  if (local_70.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar2 = (StringCompareMethod *)operator_new(0x68);
  StringCompareMethod::StringCompareMethod(pSVar2,this,ICompare,true);
  local_138._M_head_impl = (StringLenMethod *)pSVar2;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringCompareMethod,std::default_delete<slang::ast::builtins::StringCompareMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             (unique_ptr<slang::ast::builtins::StringCompareMethod,_std::default_delete<slang::ast::builtins::StringCompareMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_80);
  if (local_80.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  this_03 = (StringSubstrMethod *)operator_new(0x68);
  StringSubstrMethod::StringSubstrMethod(this_03,this);
  local_138._M_head_impl = (StringLenMethod *)this_03;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringSubstrMethod,std::default_delete<slang::ast::builtins::StringSubstrMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             (unique_ptr<slang::ast::builtins::StringSubstrMethod,_std::default_delete<slang::ast::builtins::StringSubstrMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_90);
  if (local_90.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar3 = (StringAtoIMethod *)operator_new(0x68);
  StringAtoIMethod::StringAtoIMethod(pSVar3,this,AToI,10);
  local_138._M_head_impl = (StringLenMethod *)pSVar3;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_a0);
  if (local_a0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar3 = (StringAtoIMethod *)operator_new(0x68);
  StringAtoIMethod::StringAtoIMethod(pSVar3,this,AToHex,0x10);
  local_138._M_head_impl = (StringLenMethod *)pSVar3;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_b0);
  if (local_b0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar3 = (StringAtoIMethod *)operator_new(0x68);
  StringAtoIMethod::StringAtoIMethod(pSVar3,this,AToOct,8);
  local_138._M_head_impl = (StringLenMethod *)pSVar3;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_c0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_c0);
  if (local_c0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar3 = (StringAtoIMethod *)operator_new(0x68);
  StringAtoIMethod::StringAtoIMethod(pSVar3,this,AToBin,2);
  local_138._M_head_impl = (StringLenMethod *)pSVar3;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoIMethod,std::default_delete<slang::ast::builtins::StringAtoIMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_d0,
             (unique_ptr<slang::ast::builtins::StringAtoIMethod,_std::default_delete<slang::ast::builtins::StringAtoIMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_d0);
  if (local_d0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  this_04 = (StringAtoRealMethod *)operator_new(0x68);
  StringAtoRealMethod::StringAtoRealMethod(this_04,this);
  local_138._M_head_impl = (StringLenMethod *)this_04;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringAtoRealMethod,std::default_delete<slang::ast::builtins::StringAtoRealMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_e0,
             (unique_ptr<slang::ast::builtins::StringAtoRealMethod,_std::default_delete<slang::ast::builtins::StringAtoRealMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_e0);
  if (local_e0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar4 = (StringItoAMethod *)operator_new(0x68);
  StringItoAMethod::StringItoAMethod(pSVar4,this,IToA,Decimal);
  local_138._M_head_impl = (StringLenMethod *)pSVar4;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_f0,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_f0);
  if (local_f0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar4 = (StringItoAMethod *)operator_new(0x68);
  StringItoAMethod::StringItoAMethod(pSVar4,this,HexToA,Hex);
  local_138._M_head_impl = (StringLenMethod *)pSVar4;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_100,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_100);
  if (local_100.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar4 = (StringItoAMethod *)operator_new(0x68);
  StringItoAMethod::StringItoAMethod(pSVar4,this,OctToA,Octal);
  local_138._M_head_impl = (StringLenMethod *)pSVar4;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_110,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_110);
  if (local_110.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  pSVar4 = (StringItoAMethod *)operator_new(0x68);
  StringItoAMethod::StringItoAMethod(pSVar4,this,BinToA,Binary);
  local_138._M_head_impl = (StringLenMethod *)pSVar4;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringItoAMethod,std::default_delete<slang::ast::builtins::StringItoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_120,
             (unique_ptr<slang::ast::builtins::StringItoAMethod,_std::default_delete<slang::ast::builtins::StringItoAMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_120);
  if (local_120.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  this_05 = (StringRealtoAMethod *)operator_new(0x68);
  StringRealtoAMethod::StringRealtoAMethod(this_05,this);
  local_138._M_head_impl = (StringLenMethod *)this_05;
  std::__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::ast::builtins::StringRealtoAMethod,std::default_delete<slang::ast::builtins::StringRealtoAMethod>,void>
            ((__shared_ptr<slang::ast::SystemSubroutine,(__gnu_cxx::_Lock_policy)2> *)&local_130,
             (unique_ptr<slang::ast::builtins::StringRealtoAMethod,_std::default_delete<slang::ast::builtins::StringRealtoAMethod>_>
              *)&local_138);
  addSystemMethod(this,StringType,&local_130);
  if (local_130.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138._M_head_impl != (StringLenMethod *)0x0) {
    (*((local_138._M_head_impl)->super_SimpleSystemSubroutine).super_SystemSubroutine.
      _vptr_SystemSubroutine[1])();
  }
  return;
}

Assistant:

void Builtins::registerStringMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_unique<name##Method>(__VA_ARGS__))
    REGISTER(SymbolKind::StringType, StringLen, *this);
    REGISTER(SymbolKind::StringType, StringPutc, *this);
    REGISTER(SymbolKind::StringType, StringGetc, *this);
    REGISTER(SymbolKind::StringType, StringUpperLower, *this, KnownSystemName::ToUpper, true);
    REGISTER(SymbolKind::StringType, StringUpperLower, *this, KnownSystemName::ToLower, false);
    REGISTER(SymbolKind::StringType, StringCompare, *this, KnownSystemName::Compare, false);
    REGISTER(SymbolKind::StringType, StringCompare, *this, KnownSystemName::ICompare, true);
    REGISTER(SymbolKind::StringType, StringSubstr, *this);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToI, 10);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToHex, 16);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToOct, 8);
    REGISTER(SymbolKind::StringType, StringAtoI, *this, KnownSystemName::AToBin, 2);
    REGISTER(SymbolKind::StringType, StringAtoReal, *this);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::IToA,
             LiteralBase::Decimal);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::HexToA, LiteralBase::Hex);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::OctToA,
             LiteralBase::Octal);
    REGISTER(SymbolKind::StringType, StringItoA, *this, KnownSystemName::BinToA,
             LiteralBase::Binary);
    REGISTER(SymbolKind::StringType, StringRealtoA, *this);

#undef REGISTER
}